

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

int __thiscall amrex::AmrLevel::derive(AmrLevel *this,EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *puVar4;
  StateData *pSVar5;
  DeriveBoxMap p_Var6;
  FabArrayBase *this_00;
  type __s;
  char *pcVar7;
  Box *pBVar8;
  DeriveFunc p_Var9;
  DeriveFunc3D p_Var10;
  int *piVar11;
  int __c;
  string msg;
  int *bc3D;
  Real dt;
  Real *xlo;
  RealBox temp;
  int *bcr;
  Real *dx;
  int *dom_hi;
  int *dom_lo;
  int n_state;
  int *chi;
  int *clo;
  Real *cdat;
  int n_der;
  int *hi;
  int *lo;
  Box *gtbx;
  int *dhi;
  int *dlo;
  Real *ddat;
  int grid_no;
  MFIter mfi_1;
  FArrayBox *datafab;
  FArrayBox *derfab;
  Box *bx;
  MFIter mfi;
  int dncomp;
  int dc;
  int k;
  MultiFab srcMF;
  int g;
  Box bx1;
  Box bx0;
  int ngrow_src;
  BoxArray dstBA;
  BoxArray *srcBA;
  DeriveRec *rec;
  int ncomp;
  int scomp;
  int index;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *mf;
  BoxArray *in_stack_fffffffffffff7f8;
  Amr *in_stack_fffffffffffff800;
  BoxArray *in_stack_fffffffffffff808;
  BoxArray *in_stack_fffffffffffff810;
  BaseFab<double> *in_stack_fffffffffffff818;
  MFInfo *in_stack_fffffffffffff820;
  FabArrayBase *in_stack_fffffffffffff828;
  MFIter *in_stack_fffffffffffff830;
  BoxArray *in_stack_fffffffffffff838;
  function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
  *in_stack_fffffffffffff840;
  BoxArray *in_stack_fffffffffffff848;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffff850;
  Geometry *in_stack_fffffffffffff860;
  FabArrayBase *in_stack_fffffffffffff868;
  MFIter *in_stack_fffffffffffff870;
  AmrLevel *pAVar12;
  int in_stack_fffffffffffffa44;
  MultiFab *in_stack_fffffffffffffa48;
  AmrLevel *in_stack_fffffffffffffa50;
  int in_stack_fffffffffffffa60;
  Real local_590;
  MFIter *local_588;
  RealBox local_580;
  int *local_550;
  FabArrayBase *local_548;
  MFInfo *local_540;
  BaseFab<double> *local_538;
  undefined1 local_52c [20];
  double *local_518;
  undefined1 local_50c [24];
  Box local_4f4;
  Box *local_4d8;
  int *local_4d0;
  type local_4c8;
  double *local_4c0;
  int local_4b4;
  MFIter local_4b0;
  undefined8 local_430;
  FArrayBox *local_428;
  undefined1 local_41c [28];
  undefined1 *local_400;
  MFIter local_3f8;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined4 local_344;
  undefined4 local_340;
  int local_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  int local_184;
  Box local_180;
  Box local_164;
  int local_148;
  uint local_144;
  BoxArray *local_d8;
  DeriveRec *local_d0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined4 local_84;
  int local_74;
  int local_70;
  int local_6c;
  undefined1 local_65;
  int local_64;
  Real local_60;
  string *local_58;
  EVP_PKEY_CTX *local_50;
  AmrLevel *local_48;
  undefined8 local_40;
  char *local_38;
  
  local_64 = (int)keylen;
  local_65 = 0;
  pAVar12 = this;
  local_58 = (string *)key;
  local_50 = ctx;
  local_48 = this;
  std::unique_ptr<amrex::MultiFab,std::default_delete<amrex::MultiFab>>::
  unique_ptr<std::default_delete<amrex::MultiFab>,void>
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             in_stack_fffffffffffff800);
  bVar1 = isStateVariable((string *)in_stack_fffffffffffff818,(int *)in_stack_fffffffffffff810,
                          (int *)in_stack_fffffffffffff808);
  iVar2 = (int)((ulong)this >> 0x20);
  if (bVar1) {
    pSVar5 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                       ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                        in_stack_fffffffffffff800,(size_type)in_stack_fffffffffffff7f8);
    StateData::boxArray(pSVar5);
    local_84 = 1;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_98 = 0;
    MFInfo::MFInfo((MFInfo *)0x10ff19b);
    puVar4 = (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             std::
             unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          *)in_stack_fffffffffffff800);
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray_const&,amrex::DistributionMapping&,int,int&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
              (in_stack_fffffffffffff848,(DistributionMapping *)in_stack_fffffffffffff840,
               (int *)in_stack_fffffffffffff838,(int *)in_stack_fffffffffffff830,
               (MFInfo *)in_stack_fffffffffffff828,
               (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff860);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff800,puVar4);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff800);
    MFInfo::~MFInfo((MFInfo *)0x10ff235);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff800);
    FillPatch(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,
              (Real)ctx,(int)((ulong)pAVar12 >> 0x20),(int)pAVar12,iVar2,in_stack_fffffffffffffa60);
    iVar2 = (int)pAVar12;
  }
  else {
    local_d0 = DeriveList::get((DeriveList *)in_stack_fffffffffffff818,
                               (string *)in_stack_fffffffffffff810);
    if (local_d0 == (DeriveRec *)0x0) {
      std::allocator<char>::allocator();
      iVar2 = (int)pAVar12;
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffa48,
                 "AmrLevel::derive(MultiFab*): unknown variable: ",
                 (allocator *)&stack0xfffffffffffffa47);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffa47);
      std::__cxx11::string::operator+=((string *)&stack0xfffffffffffffa48,local_58);
      local_40 = std::__cxx11::string::c_str();
      Error_host((char *)in_stack_fffffffffffff810);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffa48);
    }
    else {
      DeriveRec::getRange(local_d0,0,&local_6c,&local_70,&local_74);
      pSVar5 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                         ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                          in_stack_fffffffffffff800,(size_type)in_stack_fffffffffffff7f8);
      local_d8 = StateData::boxArray(pSVar5);
      BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
      local_144 = (uint)DeriveRec::deriveType(local_d0);
      BoxArray::convert(in_stack_fffffffffffff808,
                        (IndexType)(uint)((ulong)in_stack_fffffffffffff810 >> 0x20));
      local_148 = local_64;
      BoxArray::operator[]
                (in_stack_fffffffffffff810,(int)((ulong)in_stack_fffffffffffff808 >> 0x20));
      p_Var6 = DeriveRec::boxMap(local_d0);
      (*p_Var6)(&local_180,&local_164);
      iVar2 = Box::smallEnd(&local_164,0);
      local_184 = Box::smallEnd(&local_180,0);
      local_184 = iVar2 - local_184;
      local_148 = local_148 + local_184;
      DeriveRec::numState(local_d0);
      local_328 = 0;
      uStack_320 = 0;
      local_338 = 0;
      uStack_330 = 0;
      local_318 = 0;
      MFInfo::MFInfo((MFInfo *)0x10ff4c4);
      std::
      unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
      ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                   *)in_stack_fffffffffffff800);
      MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffff840,in_stack_fffffffffffff838,
                         (DistributionMapping *)in_stack_fffffffffffff830,
                         (int)((ulong)in_stack_fffffffffffff828 >> 0x20),
                         (int)in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                         in_stack_fffffffffffff850);
      MFInfo::~MFInfo((MFInfo *)0x10ff533);
      local_340 = 0;
      for (local_33c = 0; iVar2 = local_33c, iVar3 = DeriveRec::numRange(local_d0), iVar2 < iVar3;
          local_33c = local_33c + 1) {
        DeriveRec::getRange(local_d0,local_33c,&local_6c,&local_70,&local_74);
        FillPatch(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,
                  (Real)ctx,(int)((ulong)pAVar12 >> 0x20),(int)pAVar12,(int)((ulong)this >> 0x20),
                  in_stack_fffffffffffffa60);
        local_340 = local_74 + local_340;
      }
      local_344 = DeriveRec::numDerive(local_d0);
      local_368 = 0;
      uStack_360 = 0;
      local_378 = 0;
      uStack_370 = 0;
      local_358 = 0;
      MFInfo::MFInfo((MFInfo *)0x10ff6ca);
      this_00 = (FabArrayBase *)
                std::
                unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             *)in_stack_fffffffffffff800);
      std::
      make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
                (in_stack_fffffffffffff848,(DistributionMapping *)in_stack_fffffffffffff840,
                 (int *)in_stack_fffffffffffff838,(int *)in_stack_fffffffffffff830,
                 (MFInfo *)in_stack_fffffffffffff828,
                 (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff860);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff800,
                 (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)this_00);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff800);
      MFInfo::~MFInfo((MFInfo *)0x10ff75c);
      DeriveRec::derFuncFab((DeriveRec *)this_00);
      bVar1 = std::operator!=((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
                               *)in_stack_fffffffffffff800,this_00);
      std::
      function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
      ::~function((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
                   *)0x10ff796);
      if (bVar1) {
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                   in_stack_fffffffffffff800);
        TilingIfNotGPU();
        MFIter::MFIter(in_stack_fffffffffffff830,in_stack_fffffffffffff828,
                       SUB81((ulong)in_stack_fffffffffffff820 >> 0x38,0));
        while( true ) {
          bVar1 = MFIter::isValid(&local_3f8);
          iVar2 = (int)pAVar12;
          if (!bVar1) break;
          MFIter::growntilebox
                    (in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
          local_400 = local_41c;
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                     in_stack_fffffffffffff800);
          local_428 = FabArray<amrex::FArrayBox>::operator[]
                                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff800,
                                 (MFIter *)this_00);
          local_430 = FabArray<amrex::FArrayBox>::operator[]
                                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff800,
                                 (MFIter *)this_00);
          DeriveRec::derFuncFab((DeriveRec *)this_00);
          this_00 = (FabArrayBase *)(ctx + 0x10);
          in_stack_fffffffffffff800 = (Amr *)DeriveRec::getBC(local_d0);
          std::
          function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
          ::operator()(in_stack_fffffffffffff840,(Box *)in_stack_fffffffffffff838,
                       (FArrayBox *)in_stack_fffffffffffff830,
                       (int)((ulong)in_stack_fffffffffffff828 >> 0x20),
                       (int)in_stack_fffffffffffff828,(FArrayBox *)in_stack_fffffffffffff820,
                       in_stack_fffffffffffff860,(double)in_stack_fffffffffffff818,
                       (int *)in_stack_fffffffffffff868,(int)in_stack_fffffffffffff870);
          std::
          function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
          ::~function((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
                       *)0x10ff9ae);
          MFIter::operator++(&local_3f8);
        }
        MFIter::~MFIter((MFIter *)in_stack_fffffffffffff800);
      }
      else {
        __s = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                        ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                         in_stack_fffffffffffff800);
        MFIter::MFIter(in_stack_fffffffffffff830,in_stack_fffffffffffff828,
                       SUB81((ulong)in_stack_fffffffffffff820 >> 0x38,0));
        while( true ) {
          bVar1 = MFIter::isValid(&local_4b0);
          iVar2 = (int)pAVar12;
          if (!bVar1) break;
          pcVar7 = MFIter::index(&local_4b0,(char *)__s,__c);
          local_4b4 = (int)pcVar7;
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                     in_stack_fffffffffffff800);
          FabArray<amrex::FArrayBox>::operator[]
                    ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff800,(MFIter *)this_00);
          local_4c0 = BaseFab<double>::dataPtr
                                (in_stack_fffffffffffff818,
                                 (int)((ulong)in_stack_fffffffffffff810 >> 0x20));
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                     in_stack_fffffffffffff800);
          FabArray<amrex::FArrayBox>::operator[]
                    ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff800,(MFIter *)this_00);
          local_4c8 = (type)BaseFab<double>::loVect((BaseFab<double> *)0x10ffaec);
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                     in_stack_fffffffffffff800);
          FabArray<amrex::FArrayBox>::operator[]
                    ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff800,(MFIter *)this_00);
          local_4d0 = BaseFab<double>::hiVect((BaseFab<double> *)0x10ffb28);
          MFIter::growntilebox
                    (in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
          local_4d8 = &local_4f4;
          local_50c._12_8_ = Box::loVect(local_4d8);
          local_50c._4_8_ = Box::hiVect(local_4d8);
          local_50c._0_4_ = DeriveRec::numDerive(local_d0);
          FabArray<amrex::FArrayBox>::operator[]
                    ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff800,(MFIter *)this_00);
          local_518 = BaseFab<double>::dataPtr
                                (in_stack_fffffffffffff818,
                                 (int)((ulong)in_stack_fffffffffffff810 >> 0x20));
          FabArray<amrex::FArrayBox>::operator[]
                    ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff800,(MFIter *)this_00);
          local_52c._12_8_ = BaseFab<double>::loVect((BaseFab<double> *)0x10ffbdc);
          FabArray<amrex::FArrayBox>::operator[]
                    ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff800,(MFIter *)this_00);
          local_52c._4_8_ = BaseFab<double>::hiVect((BaseFab<double> *)0x10ffc01);
          local_52c._0_4_ = DeriveRec::numState(local_d0);
          pSVar5 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                             ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                              in_stack_fffffffffffff800,(size_type)this_00);
          pBVar8 = StateData::getDomain(pSVar5);
          local_538 = (BaseFab<double> *)Box::loVect(pBVar8);
          pSVar5 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                             ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                              in_stack_fffffffffffff800,(size_type)this_00);
          pBVar8 = StateData::getDomain(pSVar5);
          local_540 = (MFInfo *)Box::hiVect(pBVar8);
          local_548 = (FabArrayBase *)CoordSys::CellSize((CoordSys *)(ctx + 0x10));
          local_550 = DeriveRec::getBC(local_d0);
          CoordSys::CellSize((CoordSys *)(ctx + 0x10));
          Geometry::ProbLo((Geometry *)0x10ffced);
          RealBox::RealBox((RealBox *)in_stack_fffffffffffff830,(Box *)in_stack_fffffffffffff828,
                           (Real *)in_stack_fffffffffffff820,(Real *)in_stack_fffffffffffff818);
          local_588 = (MFIter *)RealBox::lo(&local_580);
          __s = (type)(ulong)*(uint *)(ctx + 8);
          local_590 = Amr::dtLevel(in_stack_fffffffffffff800,(int)((ulong)this_00 >> 0x20));
          p_Var9 = DeriveRec::derFunc(local_d0);
          if (p_Var9 == (DeriveFunc)0x0) {
            p_Var10 = DeriveRec::derFunc3D(local_d0);
            if (p_Var10 == (DeriveFunc3D)0x0) {
              local_38 = "AmrLevel::derive: no function available";
              Error_host((char *)in_stack_fffffffffffff810);
            }
            else {
              piVar11 = DeriveRec::getBC3D(local_d0);
              p_Var10 = DeriveRec::derFunc3D(local_d0);
              in_stack_fffffffffffff800 = (Amr *)local_52c;
              __s = local_4c8;
              this_00 = (FabArrayBase *)local_52c._4_8_;
              in_stack_fffffffffffff810 = (BoxArray *)local_50c._4_8_;
              in_stack_fffffffffffff818 = local_538;
              in_stack_fffffffffffff820 = local_540;
              in_stack_fffffffffffff828 = local_548;
              in_stack_fffffffffffff830 = local_588;
              (*p_Var10)(local_4c0,(int *)local_4c8,local_4d0,(int *)local_50c,local_518,
                         (int *)local_52c._12_8_,(int *)local_52c._4_8_,
                         (int *)in_stack_fffffffffffff800,(int *)local_50c._12_8_,
                         (int *)local_50c._4_8_,(int *)local_538,(int *)local_540,(Real *)local_548,
                         (Real *)local_588,&local_60,&local_590,piVar11,(int *)(ctx + 8),&local_4b4)
              ;
            }
          }
          else {
            p_Var9 = DeriveRec::derFunc(local_d0);
            this_00 = (FabArrayBase *)(local_4d0 + 2);
            in_stack_fffffffffffff818 =
                 (BaseFab<double> *)&((BATransformer *)local_52c._12_8_)->m_op;
            in_stack_fffffffffffff820 =
                 (MFInfo *)&(((BATransformer *)local_52c._12_8_)->m_op).m_bndryReg.m_typ;
            in_stack_fffffffffffff830 = (MFIter *)&((string *)local_52c._4_8_)->field_0x4;
            in_stack_fffffffffffff800 = (Amr *)local_50c;
            __s = local_4c8;
            in_stack_fffffffffffff810 = (BoxArray *)local_52c._12_8_;
            in_stack_fffffffffffff828 = (FabArrayBase *)local_52c._4_8_;
            in_stack_fffffffffffff868 = local_548;
            in_stack_fffffffffffff870 = local_588;
            (*p_Var9)(local_4c0,(int *)local_4c8,
                      (int *)((long)&(local_4c8->super_FabArray<amrex::FArrayBox>).
                                     super_FabArrayBase._vptr_FabArrayBase + 4),
                      (int *)&(local_4c8->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                              boxarray,local_4d0,local_4d0 + 1,(int *)this_00,
                      (int *)in_stack_fffffffffffff800,local_518,(int *)local_52c._12_8_,
                      (int *)in_stack_fffffffffffff818,(int *)in_stack_fffffffffffff820,
                      (int *)local_52c._4_8_,(int *)in_stack_fffffffffffff830,
                      (int *)(local_52c._4_8_ + 8),(int *)local_52c,(int *)local_50c._12_8_,
                      (int *)local_50c._4_8_,(int *)local_538,(int *)local_540,(Real *)local_548,
                      (Real *)local_588,&local_60,&local_590,local_550,(int *)(ctx + 8),&local_4b4);
          }
          MFIter::operator++(&local_4b0);
        }
        MFIter::~MFIter((MFIter *)in_stack_fffffffffffff800);
      }
      MultiFab::~MultiFab((MultiFab *)0x11000ff);
      BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff800);
    }
  }
  return iVar2;
}

Assistant:

std::unique_ptr<MultiFab>
AmrLevel::derive (const std::string& name, Real time, int ngrow)
{
    BL_ASSERT(ngrow >= 0);

    std::unique_ptr<MultiFab> mf;

    int index, scomp, ncomp;

    if (isStateVariable(name, index, scomp))
    {
        mf = std::make_unique<MultiFab>(state[index].boxArray(), dmap, 1, ngrow, MFInfo(), *m_factory);
        FillPatch(*this,*mf,ngrow,time,index,scomp,1,0);
    }
    else if (const DeriveRec* rec = derive_lst.get(name))
    {
        rec->getRange(0, index, scomp, ncomp);

        const BoxArray& srcBA = state[index].boxArray();

        BoxArray dstBA(srcBA);
        dstBA.convert(rec->deriveType());

        int ngrow_src = ngrow;
        {
            Box bx0 = srcBA[0];
            Box bx1 = rec->boxMap()(bx0);
            int g = bx0.smallEnd(0) - bx1.smallEnd(0);
            ngrow_src += g;
        }

        MultiFab srcMF(srcBA, dmap, rec->numState(), ngrow_src, MFInfo(), *m_factory);

        for (int k = 0, dc = 0; k < rec->numRange(); k++, dc += ncomp)
        {
            rec->getRange(k, index, scomp, ncomp);
            FillPatch(*this,srcMF,ngrow_src,time,index,scomp,ncomp,dc);
        }

        const int dncomp = rec->numDerive();
        mf = std::make_unique<MultiFab>(dstBA, dmap, dncomp, ngrow, MFInfo(), *m_factory);

        if (rec->derFuncFab() != nullptr)
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.growntilebox(ngrow);
                FArrayBox& derfab = (*mf)[mfi];
                FArrayBox const& datafab = srcMF[mfi];
                rec->derFuncFab()(bx, derfab, 0, dncomp, datafab, geom, time, rec->getBC(), level);
            }
        }
        else
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(*mf,true); mfi.isValid(); ++mfi)
        {
            int         grid_no = mfi.index();
            Real*       ddat    = (*mf)[mfi].dataPtr();
            const int*  dlo     = (*mf)[mfi].loVect();
            const int*  dhi     = (*mf)[mfi].hiVect();
            const Box&  gtbx    = mfi.growntilebox();
            const int*  lo      = gtbx.loVect();
            const int*  hi      = gtbx.hiVect();
            int         n_der   = rec->numDerive();
            Real*       cdat    = srcMF[mfi].dataPtr();
            const int*  clo     = srcMF[mfi].loVect();
            const int*  chi     = srcMF[mfi].hiVect();
            int         n_state = rec->numState();
            const int*  dom_lo  = state[index].getDomain().loVect();
            const int*  dom_hi  = state[index].getDomain().hiVect();
            const Real* dx      = geom.CellSize();
            const int*  bcr     = rec->getBC();
            const RealBox temp    (gtbx,geom.CellSize(),geom.ProbLo());
            const Real* xlo     = temp.lo();
            Real        dt      = parent->dtLevel(level);

            if (rec->derFunc() != static_cast<DeriveFunc>(0)){
               rec->derFunc()(ddat,AMREX_ARLIM(dlo),AMREX_ARLIM(dhi),&n_der,
                              cdat,AMREX_ARLIM(clo),AMREX_ARLIM(chi),&n_state,
                              lo,hi,dom_lo,dom_hi,dx,xlo,&time,&dt,bcr,
                              &level,&grid_no);
            } else if (rec->derFunc3D() != static_cast<DeriveFunc3D>(0)){
               const int *bc3D = rec->getBC3D();
               rec->derFunc3D()(ddat,AMREX_ARLIM_3D(dlo),AMREX_ARLIM_3D(dhi),&n_der,
                                cdat,AMREX_ARLIM_3D(clo),AMREX_ARLIM_3D(chi),&n_state,
                                AMREX_ARLIM_3D(lo),AMREX_ARLIM_3D(hi),
                                AMREX_ARLIM_3D(dom_lo),AMREX_ARLIM_3D(dom_hi),
                                AMREX_ZFILL(dx),AMREX_ZFILL(xlo),
                                &time,&dt,
                                bc3D,
                                &level,&grid_no);
            } else {
               amrex::Error("AmrLevel::derive: no function available");
            }
        }
        }
    }
    else
    {
        //
        // If we got here, cannot derive given name.
        //
        std::string msg("AmrLevel::derive(MultiFab*): unknown variable: ");
        msg += name;
        amrex::Error(msg.c_str());
    }

    return mf;
}